

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::reallocate
          (QMovableArrayOps<QTimeZone::OffsetData> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QTimeZone::OffsetData>_*,_QTimeZone::OffsetData_*> pVar1;
  
  pVar1 = QTypedArrayData<QTimeZone::OffsetData>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                     super_QArrayDataPointer<QTimeZone::OffsetData>.d,
                     (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                     super_QArrayDataPointer<QTimeZone::OffsetData>.ptr,alloc,option);
  if (pVar1.second != (OffsetData *)0x0) {
    (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
    super_QArrayDataPointer<QTimeZone::OffsetData>.d = pVar1.first;
    (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
    super_QArrayDataPointer<QTimeZone::OffsetData>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }